

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O2

void Q_SetKer(QMatrix *Q,Vector *RightKer,Vector *LeftKer)

{
  ulong uVar1;
  Real *pRVar2;
  bool bVar3;
  LASErrIdType LVar4;
  ulong uVar5;
  Real *pRVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  
  V_Lock(RightKer);
  V_Lock(LeftKer);
  LVar4 = LASResult();
  if (LVar4 != LASOK) goto LAB_0010e4c3;
  uVar1 = Q->Dim;
  LVar4 = LASDimErr;
  if ((uVar1 == RightKer->Dim) && ((Q->Symmetry != False || (uVar1 == LeftKer->Dim)))) {
    if (Q->RightKerCmp != (Real *)0x0) {
      free(Q->RightKerCmp);
      Q->RightKerCmp = (Real *)0x0;
    }
    if (Q->LeftKerCmp != (Real *)0x0) {
      free(Q->LeftKerCmp);
      Q->LeftKerCmp = (Real *)0x0;
    }
    Q->UnitLeftKer = False;
    pRVar2 = RightKer->Cmp;
    dVar7 = 0.0;
    for (uVar5 = 1; uVar5 <= uVar1; uVar5 = uVar5 + 1) {
      dVar7 = dVar7 + pRVar2[uVar5];
    }
    auVar8._8_4_ = (int)(uVar1 >> 0x20);
    auVar8._0_8_ = uVar1;
    auVar8._12_4_ = 0x45300000;
    dVar9 = (auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    dVar7 = dVar7 / dVar9;
    Q->UnitRightKer = True;
    if (2.2250738585072014e-307 <= ABS(dVar7)) {
      bVar3 = true;
      for (uVar5 = 1; uVar5 <= uVar1; uVar5 = uVar5 + 1) {
        if (2.220446049250313e-15 <= ABS(pRVar2[uVar5] / dVar7 + -1.0)) {
          Q->UnitRightKer = False;
          bVar3 = false;
        }
      }
      if (!bVar3) goto LAB_0010e2bd;
    }
    else {
      Q->UnitRightKer = False;
LAB_0010e2bd:
      dVar7 = 0.0;
      for (uVar5 = 1; uVar5 <= uVar1; uVar5 = uVar5 + 1) {
        dVar7 = dVar7 + pRVar2[uVar5] * pRVar2[uVar5];
      }
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      if (2.2250738585072014e-307 <= ABS(dVar7)) {
        pRVar6 = (Real *)malloc(uVar1 * 8 + 8);
        Q->RightKerCmp = pRVar6;
        if (pRVar6 == (Real *)0x0) {
          LASError(LASMemAllocErr,"Q_SetKer",Q->Name,RightKer->Name,LeftKer->Name);
        }
        else {
          for (uVar5 = 1; uVar5 <= uVar1; uVar5 = uVar5 + 1) {
            pRVar6[uVar5] = pRVar2[uVar5] / dVar7;
          }
        }
      }
    }
    if (Q->Symmetry != False) goto LAB_0010e4c3;
    pRVar2 = LeftKer->Cmp;
    dVar7 = 0.0;
    for (uVar5 = 1; uVar5 <= uVar1; uVar5 = uVar5 + 1) {
      dVar7 = dVar7 + pRVar2[uVar5];
    }
    dVar7 = dVar7 / dVar9;
    Q->UnitLeftKer = True;
    if (2.2250738585072014e-307 <= ABS(dVar7)) {
      bVar3 = true;
      for (uVar5 = 1; uVar5 <= uVar1; uVar5 = uVar5 + 1) {
        if (2.220446049250313e-15 <= ABS(pRVar2[uVar5] / dVar7 + -1.0)) {
          Q->UnitLeftKer = False;
          bVar3 = false;
        }
      }
      if (bVar3) goto LAB_0010e4c3;
    }
    else {
      Q->UnitLeftKer = False;
    }
    dVar7 = 0.0;
    for (uVar5 = 1; uVar5 <= uVar1; uVar5 = uVar5 + 1) {
      dVar7 = dVar7 + pRVar2[uVar5] * pRVar2[uVar5];
    }
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    if (ABS(dVar7) < 2.2250738585072014e-307) goto LAB_0010e4c3;
    pRVar6 = (Real *)malloc(uVar1 * 8 + 8);
    Q->LeftKerCmp = pRVar6;
    if (pRVar6 != (Real *)0x0) {
      for (uVar5 = 1; uVar5 <= uVar1; uVar5 = uVar5 + 1) {
        pRVar6[uVar5] = pRVar2[uVar5] / dVar7;
      }
      goto LAB_0010e4c3;
    }
    LVar4 = LASMemAllocErr;
  }
  LASError(LVar4,"Q_SetKer",Q->Name,RightKer->Name,LeftKer->Name);
LAB_0010e4c3:
  V_Unlock(RightKer);
  V_Unlock(LeftKer);
  return;
}

Assistant:

void Q_SetKer(QMatrix *Q, Vector *RightKer, Vector *LeftKer)
/* defines the null space in the case of a singular matrix */
{
    double Sum, Mean, Cmp, Norm;
    size_t Dim, Ind;
    Real *KerCmp;

    V_Lock(RightKer);
    V_Lock(LeftKer);
    
    if (LASResult() == LASOK) {
	if (Q->Dim == RightKer->Dim && (Q->Symmetry || Q->Dim == LeftKer->Dim)) {
  	    Dim = Q->Dim;
	    
	    /* release array for old null space components when it exists */ 
	    if (Q->RightKerCmp != NULL) {
	        free(Q->RightKerCmp);
	        Q->RightKerCmp = NULL;
	    }
	    if (Q->LeftKerCmp != NULL) {
	        free(Q->LeftKerCmp);
	        Q->LeftKerCmp = NULL;
	    }
	    Q->UnitRightKer = False;
	    Q->UnitLeftKer = False;
	    
	    /* right null space */
            KerCmp = RightKer->Cmp;
	    /* test whether the matrix Q has a unit right null space */
	    Sum = 0.0;
	    for(Ind = 1; Ind <= Dim; Ind++)
	        Sum += KerCmp[Ind];
	    Mean = Sum / (double)Dim;
	    Q->UnitRightKer = True;
	    if (!IsZero(Mean)) {
	        for(Ind = 1; Ind <= Dim; Ind++)
                    if (!IsOne(KerCmp[Ind] / Mean))
		        Q->UnitRightKer = False;
            } else {
	        Q->UnitRightKer = False;
	    }
	    if (!Q->UnitRightKer) {
	        Sum = 0.0;
	        for(Ind = 1; Ind <= Dim; Ind++) {
	            Cmp = KerCmp[Ind];
	            Sum += Cmp * Cmp;
	        }
		Norm = sqrt(Sum);
		if (!IsZero(Norm)) {
                    Q->RightKerCmp = (Real *)malloc((Dim + 1) * sizeof(Real));
		    if (Q->RightKerCmp != NULL) {
		        for(Ind = 1; Ind <= Dim; Ind++)
	                    Q->RightKerCmp[Ind] = KerCmp[Ind] / Norm;
		    } else {
	                LASError(LASMemAllocErr, "Q_SetKer", Q->Name, RightKer->Name,
		            LeftKer->Name);
		    }
		}
	    }
	    
	    if (!Q->Symmetry) {
	        /* left null space */
                KerCmp = LeftKer->Cmp;
	        /* test whether the matrix Q has a unit left null space */
	        Sum = 0.0;
	        for(Ind = 1; Ind <= Dim; Ind++)
	            Sum += KerCmp[Ind];
	        Mean = Sum / (double)Dim;
	        Q->UnitLeftKer = True;
	        if (!IsZero(Mean)) {
	            for(Ind = 1; Ind <= Dim; Ind++)
                        if (!IsOne(KerCmp[Ind] / Mean))
		            Q->UnitLeftKer = False;
                } else {
	            Q->UnitLeftKer = False;
	        }
	        if (!Q->UnitLeftKer) {
	            Sum = 0.0;
	            for(Ind = 1; Ind <= Dim; Ind++) {
	                Cmp = KerCmp[Ind];
	                Sum += Cmp * Cmp;
	            }
		    Norm = sqrt(Sum);
		    if (!IsZero(Norm)) {
                        Q->LeftKerCmp = (Real *)malloc((Dim + 1) * sizeof(Real));
		        if (Q->LeftKerCmp != NULL) {
		            for(Ind = 1; Ind <= Dim; Ind++)
	                        Q->LeftKerCmp[Ind] = KerCmp[Ind] / Norm;
		        } else {
	                    LASError(LASMemAllocErr, "Q_SetKer", Q->Name,
				RightKer->Name, LeftKer->Name);
		        }
	    	    }
	        }
	    } else {
	    }
	} else {
	    LASError(LASDimErr, "Q_SetKer", Q->Name, RightKer->Name, LeftKer->Name);
	}
    }

    V_Unlock(RightKer);
    V_Unlock(LeftKer);
}